

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeTargetDepends.cxx
# Opt level: O2

void __thiscall
cmComputeTargetDepends::AddTargetDepend
          (cmComputeTargetDepends *this,int depender_index,cmGeneratorTarget *dependee,
          cmListFileBacktrace *dependee_backtrace,bool linking,bool cross)

{
  bool bVar1;
  iterator iVar2;
  set<cmLinkItem,_std::less<cmLinkItem>,_std::allocator<cmLinkItem>_> *psVar3;
  _Base_ptr p_Var4;
  int dependee_index;
  bool local_3a;
  bool local_39;
  cmGeneratorTarget *local_38;
  int local_2c;
  
  local_3a = cross;
  local_38 = dependee;
  bVar1 = cmGeneratorTarget::IsInBuildSystem(dependee);
  if (bVar1) {
    iVar2 = std::
            _Rb_tree<const_cmGeneratorTarget_*,_std::pair<const_cmGeneratorTarget_*const,_int>,_std::_Select1st<std::pair<const_cmGeneratorTarget_*const,_int>_>,_std::less<const_cmGeneratorTarget_*>,_std::allocator<std::pair<const_cmGeneratorTarget_*const,_int>_>_>
            ::find(&(this->TargetIndex)._M_t,&local_38);
    if ((_Rb_tree_header *)iVar2._M_node == &(this->TargetIndex)._M_t._M_impl.super__Rb_tree_header)
    {
      __assert_fail("tii != this->TargetIndex.end()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmComputeTargetDepends.cxx"
                    ,0x19e,
                    "void cmComputeTargetDepends::AddTargetDepend(int, const cmGeneratorTarget *, const cmListFileBacktrace &, bool, bool)"
                   );
    }
    local_2c = *(int *)&iVar2._M_node[1]._M_parent;
    local_39 = !linking;
    std::vector<cmGraphEdge,std::allocator<cmGraphEdge>>::
    emplace_back<int&,bool,bool&,cmListFileBacktrace_const&>
              ((vector<cmGraphEdge,std::allocator<cmGraphEdge>> *)
               ((this->InitialGraph).super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>
                .super__Vector_base<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>._M_impl.
                super__Vector_impl_data._M_start + depender_index),&local_2c,&local_39,&local_3a,
               dependee_backtrace);
  }
  else {
    psVar3 = cmGeneratorTarget::GetUtilityItems(dependee);
    for (p_Var4 = (psVar3->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var4 != &(psVar3->_M_t)._M_impl.super__Rb_tree_header;
        p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4)) {
      if (*(cmGeneratorTarget **)(p_Var4 + 2) != (cmGeneratorTarget *)0x0) {
        AddTargetDepend(this,depender_index,*(cmGeneratorTarget **)(p_Var4 + 2),
                        (cmListFileBacktrace *)&p_Var4[2]._M_left,false,
                        *(bool *)&p_Var4[2]._M_parent);
      }
    }
  }
  return;
}

Assistant:

void cmComputeTargetDepends::AddTargetDepend(
  int depender_index, cmGeneratorTarget const* dependee,
  cmListFileBacktrace const& dependee_backtrace, bool linking, bool cross)
{
  if (!dependee->IsInBuildSystem()) {
    // Skip targets that are not in the buildsystem but follow their
    // utility dependencies.
    std::set<cmLinkItem> const& utils = dependee->GetUtilityItems();
    for (cmLinkItem const& i : utils) {
      if (cmGeneratorTarget const* transitive_dependee = i.Target) {
        this->AddTargetDepend(depender_index, transitive_dependee, i.Backtrace,
                              false, i.Cross);
      }
    }
  } else {
    // Lookup the index for this target.  All targets should be known by
    // this point.
    auto tii = this->TargetIndex.find(dependee);
    assert(tii != this->TargetIndex.end());
    int dependee_index = tii->second;

    // Add this entry to the dependency graph.
    this->InitialGraph[depender_index].emplace_back(dependee_index, !linking,
                                                    cross, dependee_backtrace);
  }
}